

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O3

void __thiscall QSizeGripPrivate::updateTopLevelWidget(QSizeGripPrivate *this)

{
  QObject *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  QObject *pQVar4;
  QObject *pQVar5;
  
  for (pQVar5 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8; pQVar5 != (QObject *)0x0;
      pQVar5 = *(QObject **)(*(long *)(pQVar5 + 8) + 0x10)) {
    if (((*(uint *)(*(long *)(pQVar5 + 0x20) + 0xc) & 1) != 0) ||
       ((*(uint *)(*(long *)(pQVar5 + 0x20) + 0xc) & 0xff) == 0x12)) goto LAB_00475bfd;
  }
  pQVar5 = (QObject *)0x0;
LAB_00475bfd:
  pDVar3 = (this->tlw).wp.d;
  if (pDVar3 == (Data *)0x0) {
    if (pQVar5 == (QObject *)0x0) {
      return;
    }
  }
  else {
    pQVar1 = (this->tlw).wp.value;
    pQVar4 = (QObject *)0x0;
    if (*(int *)(pDVar3 + 4) != 0) {
      pQVar4 = pQVar1;
    }
    if (pQVar4 == pQVar5) {
      return;
    }
    if (pQVar1 != (QObject *)0x0 && *(int *)(pDVar3 + 4) != 0) {
      QObject::removeEventFilter(pQVar1);
    }
    if (pQVar5 == (QObject *)0x0) {
      pDVar3 = (Data *)0x0;
      goto LAB_00475c5a;
    }
  }
  pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar5);
LAB_00475c5a:
  pDVar2 = (this->tlw).wp.d;
  (this->tlw).wp.d = pDVar3;
  (this->tlw).wp.value = pQVar5;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      operator_delete(pDVar2);
    }
    pDVar3 = (this->tlw).wp.d;
  }
  if ((pDVar3 != (Data *)0x0) &&
     (pQVar5 = (this->tlw).wp.value, pQVar5 != (QObject *)0x0 && *(int *)(pDVar3 + 4) != 0)) {
    QObject::installEventFilter(pQVar5);
    return;
  }
  return;
}

Assistant:

void updateTopLevelWidget()
    {
        Q_Q(QSizeGrip);
        QWidget *w = qt_sizegrip_topLevelWidget(q);
        if (tlw == w)
            return;
        if (tlw)
            tlw->removeEventFilter(q);
        tlw = w;
        if (tlw)
            tlw->installEventFilter(q);
    }